

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

Status __thiscall leveldb::DBImpl::Recover(DBImpl *this,VersionEdit *edit,bool *save_manifest)

{
  pointer *dbname;
  long *plVar1;
  uint64_t uVar2;
  Status SVar3;
  char cVar4;
  bool bVar5;
  VersionEdit *in_RCX;
  size_t i;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  Status s;
  FileType type;
  SequenceNumber max_sequence;
  vector<unsigned_long,_std::allocator<unsigned_long>_> logs;
  uint64_t number;
  char buf [50];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> expected;
  Status local_78;
  Slice local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  plVar1 = (long *)(edit->comparator_)._M_string_length;
  dbname = &(edit->new_files_).
            super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  (**(code **)(*plVar1 + 0x50))(&local_78,plVar1,dbname);
  Status::~Status(&local_78);
  if (*(long *)((long)&edit[1].comparator_.field_2 + 8) != 0) {
    __assert_fail("db_lock_ == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                  ,0x128,"Status leveldb::DBImpl::Recover(VersionEdit *, bool *)");
  }
  plVar1 = (long *)(edit->comparator_)._M_string_length;
  LockFileName((string *)buf,(string *)dbname);
  (**(code **)(*plVar1 + 0x78))
            (&s,plVar1,(string *)buf,(undefined1 *)((long)&edit[1].comparator_.field_2 + 8));
  std::__cxx11::string::_M_dispose();
  if (s.state_ == (char *)0x0) {
    plVar1 = (long *)(edit->comparator_)._M_string_length;
    CurrentFileName((string *)buf,(string *)dbname);
    cVar4 = (**(code **)(*plVar1 + 0x30))(plVar1,(string *)buf);
    std::__cxx11::string::_M_dispose();
    if (cVar4 == '\0') {
      if ((char)edit->last_sequence_ != '\x01') {
        buf._0_8_ = (edit->new_files_).
                    super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        buf._8_8_ = (edit->new_files_).
                    super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        expected._M_t._M_impl._0_8_ = anon_var_dwarf_249ff;
        expected._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0x2b;
        expected._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        goto LAB_00112246;
      }
      NewDB((DBImpl *)buf);
      SVar3 = s;
      s.state_ = (char *)buf._0_8_;
      buf._0_8_ = SVar3.state_;
      Status::~Status((Status *)buf);
      if (s.state_ == (char *)0x0) goto LAB_00112162;
    }
    else {
      if (*(char *)((long)&edit->last_sequence_ + 1) == '\x01') {
        buf._0_8_ = (edit->new_files_).
                    super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        buf._8_8_ = (edit->new_files_).
                    super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        expected._M_t._M_impl._0_8_ = anon_var_dwarf_24a16;
        expected._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0x20;
        expected._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
LAB_00112246:
        Status::InvalidArgument((Status *)this,(Slice *)buf,(Slice *)&expected);
        goto LAB_0011208a;
      }
LAB_00112162:
      VersionSet::Recover((VersionSet *)buf,(bool *)edit[3].next_file_number_);
      SVar3 = s;
      s.state_ = (char *)buf._0_8_;
      buf._0_8_ = SVar3.state_;
      Status::~Status((Status *)buf);
      if (s.state_ == (char *)0x0) {
        max_sequence = 0;
        uVar7 = *(ulong *)(edit[3].next_file_number_ + 0x60);
        uVar2 = *(uint64_t *)(edit[3].next_file_number_ + 0x68);
        filenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        filenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        filenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        plVar1 = (long *)(edit->comparator_)._M_string_length;
        (**(code **)(*plVar1 + 0x38))((Status *)buf,plVar1,dbname);
        SVar3 = s;
        s.state_ = (char *)buf._0_8_;
        buf._0_8_ = SVar3.state_;
        Status::~Status((Status *)buf);
        if (s.state_ == (char *)0x0) {
          expected._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &expected._M_t._M_impl.super__Rb_tree_header._M_header;
          expected._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               expected._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
          expected._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          expected._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          expected._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               expected._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          VersionSet::AddLiveFiles((VersionSet *)edit[3].next_file_number_,&expected);
          logs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          logs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          logs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          lVar8 = 0;
          for (uVar6 = 0;
              uVar6 < (ulong)((long)filenames.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)filenames.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar6 = uVar6 + 1) {
            bVar5 = ParseFileName((string *)
                                  ((long)&((filenames.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                          ._M_p + lVar8),&number,&type);
            if (bVar5) {
              std::
              _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              ::erase(&expected._M_t,&number);
              if ((type == kLogFile) && ((uVar7 <= number || (number == uVar2)))) {
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&logs,&number)
                ;
              }
            }
            lVar8 = lVar8 + 0x20;
          }
          if (expected._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
            std::
            __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (logs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       logs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
            uVar7 = 0;
            while( true ) {
              uVar6 = (long)logs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)logs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3;
              if (uVar6 <= uVar7) break;
              RecoverLogFile((DBImpl *)buf,(uint64_t)edit,
                             SUB81(logs.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar7],0),
                             (bool *)(ulong)(uVar7 == uVar6 - 1),in_RCX,
                             (SequenceNumber *)save_manifest);
              SVar3 = s;
              s.state_ = (char *)buf._0_8_;
              buf._0_8_ = SVar3.state_;
              Status::~Status((Status *)buf);
              if (s.state_ != (char *)0x0) {
                (this->super_DB)._vptr_DB = (_func_int **)s.state_;
                s.state_ = (char *)0x0;
                goto LAB_00112471;
              }
              VersionSet::MarkFileNumberUsed
                        ((VersionSet *)edit[3].next_file_number_,
                         logs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar7]);
              uVar7 = uVar7 + 1;
            }
            if (((VersionSet *)edit[3].next_file_number_)->last_sequence_ < max_sequence) {
              VersionSet::SetLastSequence((VersionSet *)edit[3].next_file_number_,max_sequence);
            }
            (this->super_DB)._vptr_DB = (_func_int **)0x0;
          }
          else {
            snprintf(buf,0x32,"%d missing files; e.g.");
            local_60._M_allocated_capacity = (size_type)buf;
            local_60._8_8_ = strlen(buf);
            TableFileName(&local_50,(string *)dbname,
                          *(uint64_t *)
                           (expected._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1));
            local_70.data_ = local_50._M_dataplus._M_p;
            local_70.size_ = local_50._M_string_length;
            Status::Corruption((Status *)this,(Slice *)&local_60,&local_70);
            std::__cxx11::string::_M_dispose();
          }
LAB_00112471:
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    (&logs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
          std::
          _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
          ::~_Rb_tree(&expected._M_t);
        }
        else {
          (this->super_DB)._vptr_DB = (_func_int **)s.state_;
          s.state_ = (char *)0x0;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&filenames);
        goto LAB_0011208a;
      }
    }
  }
  (this->super_DB)._vptr_DB = (_func_int **)s.state_;
  s.state_ = (char *)0x0;
LAB_0011208a:
  Status::~Status(&s);
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::Recover(VersionEdit* edit, bool* save_manifest) {
  mutex_.AssertHeld();

  // Ignore error from CreateDir since the creation of the DB is
  // committed only when the descriptor is created, and this directory
  // may already exist from a previous failed creation attempt.
  env_->CreateDir(dbname_);
  assert(db_lock_ == nullptr);
  Status s = env_->LockFile(LockFileName(dbname_), &db_lock_);
  if (!s.ok()) {
    return s;
  }

  if (!env_->FileExists(CurrentFileName(dbname_))) {
    if (options_.create_if_missing) {
      s = NewDB();
      if (!s.ok()) {
        return s;
      }
    } else {
      return Status::InvalidArgument(
          dbname_, "does not exist (create_if_missing is false)");
    }
  } else {
    if (options_.error_if_exists) {
      return Status::InvalidArgument(dbname_,
                                     "exists (error_if_exists is true)");
    }
  }

  s = versions_->Recover(save_manifest);
  if (!s.ok()) {
    return s;
  }
  SequenceNumber max_sequence(0);

  // Recover from all newer log files than the ones named in the
  // descriptor (new log files may have been added by the previous
  // incarnation without registering them in the descriptor).
  //
  // Note that PrevLogNumber() is no longer used, but we pay
  // attention to it in case we are recovering a database
  // produced by an older version of leveldb.
  const uint64_t min_log = versions_->LogNumber();
  const uint64_t prev_log = versions_->PrevLogNumber();
  std::vector<std::string> filenames;
  s = env_->GetChildren(dbname_, &filenames);
  if (!s.ok()) {
    return s;
  }
  std::set<uint64_t> expected;
  versions_->AddLiveFiles(&expected);
  uint64_t number;
  FileType type;
  std::vector<uint64_t> logs;
  for (size_t i = 0; i < filenames.size(); i++) {
    if (ParseFileName(filenames[i], &number, &type)) {
      expected.erase(number);
      if (type == kLogFile && ((number >= min_log) || (number == prev_log)))
        logs.push_back(number);
    }
  }
  if (!expected.empty()) {
    char buf[50];
    std::snprintf(buf, sizeof(buf), "%d missing files; e.g.",
                  static_cast<int>(expected.size()));
    return Status::Corruption(buf, TableFileName(dbname_, *(expected.begin())));
  }

  // Recover in the order in which the logs were generated
  std::sort(logs.begin(), logs.end());
  for (size_t i = 0; i < logs.size(); i++) {
    s = RecoverLogFile(logs[i], (i == logs.size() - 1), save_manifest, edit,
                       &max_sequence);
    if (!s.ok()) {
      return s;
    }

    // The previous incarnation may not have written any MANIFEST
    // records after allocating this log number.  So we manually
    // update the file number allocation counter in VersionSet.
    versions_->MarkFileNumberUsed(logs[i]);
  }

  if (versions_->LastSequence() < max_sequence) {
    versions_->SetLastSequence(max_sequence);
  }

  return Status::OK();
}